

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.h
# Opt level: O1

void __thiscall
Assimp::ColladaMeshIndex::ColladaMeshIndex
          (ColladaMeshIndex *this,string *pMeshID,size_t pSubMesh,string *pMaterial)

{
  pointer pcVar1;
  
  (this->mMeshID)._M_dataplus._M_p = (pointer)&(this->mMeshID).field_2;
  pcVar1 = (pMeshID->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + pMeshID->_M_string_length);
  this->mSubMesh = pSubMesh;
  (this->mMaterial)._M_dataplus._M_p = (pointer)&(this->mMaterial).field_2;
  pcVar1 = (pMaterial->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->mMaterial,pcVar1,pcVar1 + pMaterial->_M_string_length);
  return;
}

Assistant:

ColladaMeshIndex( const std::string& pMeshID, size_t pSubMesh, const std::string& pMaterial)
        : mMeshID( pMeshID), mSubMesh( pSubMesh), mMaterial( pMaterial)
    {   }